

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O0

int Llb_ManCutLiNum(Aig_Man_t *p,Vec_Ptr_t *vMinCut)

{
  bool bVar1;
  int iVar2;
  Aig_Obj_t *pObj_00;
  int local_48;
  int local_38;
  int local_34;
  int Counter;
  int iFanout;
  int k;
  int i;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pFanout;
  Vec_Ptr_t *vMinCut_local;
  Aig_Man_t *p_local;
  
  local_34 = -1;
  local_38 = 0;
  iFanout = 0;
  do {
    iVar2 = Vec_PtrSize(vMinCut);
    if (iVar2 <= iFanout) {
      return local_38;
    }
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(vMinCut,iFanout);
    iVar2 = Aig_ObjIsCi(pObj_00);
    if (iVar2 == 0) {
      if (p->pFanData == (int *)0x0) {
        __assert_fail("p->pFanData",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                      ,0x11a,"int Llb_ManCutLiNum(Aig_Man_t *, Vec_Ptr_t *)");
      }
      Counter = 0;
      while( true ) {
        bVar1 = false;
        if (Counter < (int)((uint)(*(ulong *)&pObj_00->field_0x18 >> 6) & 0x3ffffff)) {
          if (Counter == 0) {
            local_48 = Aig_ObjFanout0Int(p,pObj_00->Id);
          }
          else {
            local_48 = Aig_ObjFanoutNext(p,local_34);
          }
          local_34 = local_48;
          pObj = Aig_ManObj(p,local_48 >> 1);
          bVar1 = true;
        }
        if (!bVar1) goto LAB_00a8ea89;
        iVar2 = Saig_ObjIsLi(p,pObj);
        if (iVar2 != 0) break;
        Counter = Counter + 1;
      }
      local_38 = local_38 + 1;
    }
LAB_00a8ea89:
    iFanout = iFanout + 1;
  } while( true );
}

Assistant:

int Llb_ManCutLiNum( Aig_Man_t * p, Vec_Ptr_t * vMinCut )
{
    Aig_Obj_t * pFanout;
    Aig_Obj_t * pObj;
    int i, k, iFanout = -1, Counter = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vMinCut, pObj, i )
    {
        if ( Aig_ObjIsCi(pObj) )
            continue;
        Aig_ObjForEachFanout( p, pObj, pFanout, iFanout, k )
        {
            if ( Saig_ObjIsLi(p, pFanout) )
            {
                Counter++;
                break;
            }
        }
    }
    return Counter;
}